

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int UnixVfs_Touch(char *zPath,jx9_int64 touch_time,jx9_int64 access_time)

{
  int iVar1;
  utimbuf ut;
  utimbuf local_10;
  
  local_10.actime = access_time;
  local_10.modtime = touch_time;
  iVar1 = utime(zPath,&local_10);
  return -(uint)(iVar1 != 0);
}

Assistant:

static int UnixVfs_Touch(const char *zPath, jx9_int64 touch_time, jx9_int64 access_time)
{
	struct utimbuf ut;
	int rc;
	ut.actime  = (time_t)access_time;
	ut.modtime = (time_t)touch_time;
	rc = utime(zPath, &ut);
	if( rc != 0 ){
	 return -1;
	}
	return JX9_OK;
}